

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  Descriptor *buffer;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long *plVar4;
  size_type *psVar5;
  int iVar6;
  Descriptor *desc_00;
  int32 i;
  long lVar7;
  long lVar8;
  undefined1 local_e0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string message_id;
  
  (anonymous_namespace)::GetPrefix_abi_cxx11_
            ((string *)local_e0,
             (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,
             *(FileDescriptor **)(desc + 0x10),*(Descriptor **)(desc + 0x18));
  io::Printer::Print<char[12],std::__cxx11::string,char[10],std::__cxx11::string>
            (printer,
             "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classprefix$$classname$ = function(opt_data) {\n"
             ,(char (*) [12])"classprefix",(string *)local_e0,(char (*) [10])0x3a8a6c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)desc);
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_);
  }
  io::Printer::Annotate<google::protobuf::Descriptor>(printer,"classname","classname",desc);
  message_id._M_dataplus._M_p = (pointer)&message_id.field_2;
  message_id._M_string_length = 0;
  message_id.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"0","");
  if (*(int *)(desc + 0x68) < 1) {
    iVar6 = 0;
  }
  else {
    lVar7 = 0;
    lVar8 = 0;
    iVar6 = 0;
    do {
      bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x28) + lVar7));
      if ((!bVar1) && (iVar2 = *(int *)(*(long *)(desc + 0x28) + 0x44 + lVar7), iVar6 < iVar2)) {
        iVar6 = iVar2;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x98;
    } while (lVar8 < *(int *)(desc + 0x68));
  }
  iVar2 = 499;
  if (iVar6 < 499) {
    iVar2 = iVar6;
  }
  i = -1;
  if (499 < iVar6) {
    i = iVar2 + 1;
  }
  if (0 < *(int *)(desc + 0x78)) {
    i = iVar2 + 1;
  }
  buffer = (Descriptor *)(local_e0 + 0x10);
  local_e0._0_8_ = buffer;
  pcVar3 = FastInt32ToBufferLeft(i,(char *)buffer);
  local_e0._8_8_ = (long)pcVar3 - (long)buffer;
  desc_00 = (Descriptor *)local_e0._0_8_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,local_e0._0_8_,(Descriptor *)(local_e0._0_8_ + local_e0._8_8_));
  bVar1 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,desc_00);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_e0,
               (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
               (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
    plVar4 = (long *)std::__cxx11::string::append(local_e0);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0.field_2._8_8_ = plVar4[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar5;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((Descriptor *)local_e0._0_8_ != buffer) {
      operator_delete((void *)local_e0._0_8_);
    }
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 4;
    local_b0.field_2._M_allocated_capacity._0_5_ = 0x6c6c756e;
  }
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            ((string *)local_e0,
             (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer,
             "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
             ,(char (*) [10])"messageId",&local_90,(char (*) [6])"pivot",&local_70,
             (char (*) [10])"rptfields",&local_b0,(char (*) [12])"oneoffields",(string *)local_e0);
  if ((Descriptor *)local_e0._0_8_ != buffer) {
    operator_delete((void *)local_e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            ((string *)local_e0,
             (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
             (GeneratorOptions *)(options->namespace_prefix)._M_string_length,desc);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  /**\n   * @public\n   * @override\n   */\n  $classname$.displayName = \'$classname$\';\n}\n"
             ,(char (*) [10])0x3a8a6c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((Descriptor *)local_e0._0_8_ != buffer) {
    operator_delete((void *)local_e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message_id._M_dataplus._M_p != &message_id.field_2) {
    operator_delete(message_id._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classprefix$$classname$ = function(opt_data) {\n",
      "classprefix", GetMessagePathPrefix(options, desc), "classname",
      desc->name());
  printer->Annotate("classname", desc);
  std::string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId",
      !message_id.empty() ? ("'" + message_id + "'")
                          : (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc), "rptfields",
      RepeatedFieldsArrayName(options, desc), "oneoffields",
      OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      // displayName overrides Function.prototype.displayName
      // http://google3/javascript/externs/es3.js?l=511
      "  /**\n"
      "   * @public\n"
      "   * @override\n"
      "   */\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}